

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::InternalUnpackTo
          (internal *this,string_view type_url,ValueType *value,Message *message)

{
  string_view type_url_00;
  bool bVar1;
  GetTypeNameReturnType local_58;
  string_view local_38;
  ValueType *local_28;
  Message *message_local;
  ValueType *value_local;
  string_view type_url_local;
  
  message_local = (Message *)type_url._M_str;
  type_url_local._M_len = type_url._M_len;
  local_28 = value;
  value_local = (ValueType *)this;
  MessageLite::GetTypeName_abi_cxx11_(&local_58,(MessageLite *)value);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  type_url_00._M_str = (char *)type_url_local._M_len;
  type_url_00._M_len = (size_t)value_local;
  bVar1 = InternalUnpackToLite
                    (local_38,type_url_00,(ValueType *)message_local,(MessageLite *)local_28);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool InternalUnpackTo(absl::string_view type_url, const ValueType& value,
                      Message* message) {
  return InternalUnpackToLite(message->GetTypeName(), type_url, value, message);
}